

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O1

uint8_t * __thiscall
google::protobuf::internal::ExtensionSet::InternalSerializeMessage
          (ExtensionSet *this,int number,MessageLite *prototype,uint8_t *target,
          EpsCopyOutputStream *stream)

{
  MessageLite *this_00;
  int iVar1;
  Extension *pEVar2;
  uint8_t *puVar3;
  undefined4 extraout_var;
  string *psVar4;
  LogMessageFatal *pLVar5;
  LogMessageFatal aLStack_38 [16];
  
  pLVar5 = aLStack_38;
  pEVar2 = FindOrNull(this,number);
  if (pEVar2 == (Extension *)0x0) {
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              (aLStack_38,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/extension_set.cc"
               ,0x210,0x14,"extension != nullptr");
    absl::lts_20240722::log_internal::LogMessage::
    CopyToEncodedBuffer<(absl::lts_20240722::log_internal::LogMessage::StringType)0>
              (aLStack_38,0xb,"not present");
    goto LAB_0025c232;
  }
  if (pEVar2->is_repeated == false) {
    psVar4 = (string *)0x0;
  }
  else {
    psVar4 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                       (0,1,
                        "(*extension).is_repeated ? REPEATED_FIELD : OPTIONAL_FIELD == OPTIONAL_FIELD"
                       );
  }
  if (psVar4 == (string *)0x0) {
    if ((byte)(pEVar2->type - 0x13) < 0xee) {
      InternalSerializeMessage();
LAB_0025c206:
      psVar4 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                         ((long)pLVar5,10,
                          "cpp_type((*extension).type) == WireFormatLite::CPPTYPE_MESSAGE");
    }
    else {
      pLVar5 = (LogMessageFatal *)
               (ulong)*(uint *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)pEVar2->type * 4);
      if (pLVar5 != (LogMessageFatal *)0xa) goto LAB_0025c206;
      psVar4 = (string *)0x0;
    }
    if (psVar4 == (string *)0x0) {
      this_00 = (MessageLite *)(pEVar2->field_0).int64_t_value;
      if ((pEVar2->field_0xa & 4) == 0) {
        iVar1 = MessageLite::GetCachedSize(this_00);
        puVar3 = WireFormatLite::InternalWriteMessage(number,this_00,iVar1,target,stream);
        return puVar3;
      }
      iVar1 = (*this_00->_vptr_MessageLite[0x13])(this_00,prototype,number,target,stream);
      return (uint8_t *)CONCAT44(extraout_var,iVar1);
    }
  }
  else {
    InternalSerializeMessage();
  }
  InternalSerializeMessage();
LAB_0025c232:
  absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(aLStack_38);
}

Assistant:

uint8_t* ExtensionSet::InternalSerializeMessage(
    int number, const MessageLite* prototype, uint8_t* target,
    io::EpsCopyOutputStream* stream) const {
  const Extension* extension = FindOrNull(number);
  ABSL_CHECK(extension != nullptr) << "not present";
  ABSL_DCHECK_TYPE(*extension, OPTIONAL_FIELD, MESSAGE);

  if (extension->is_lazy) {
    return extension->ptr.lazymessage_value->WriteMessageToArray(
        prototype, number, target, stream);
  }

  const auto* msg = extension->ptr.message_value;
  return WireFormatLite::InternalWriteMessage(
      number, *msg, msg->GetCachedSize(), target, stream);
}